

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_luma_planar
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  uVar4 = nt << 0x1e | nt - 4U >> 2;
  if (uVar4 < 4) {
    bVar3 = (byte)*(undefined4 *)(&DAT_0017766c + (ulong)uVar4 * 4);
  }
  else {
    bVar3 = 6;
  }
  iVar6 = nt + -1;
  uVar5 = 0;
  uVar1 = 0;
  if (0 < nt) {
    uVar1 = (ulong)(uint)nt;
  }
  while (uVar5 != uVar1) {
    uVar4 = (uint)uVar5;
    uVar5 = uVar5 + 1;
    iVar7 = iVar6;
    for (lVar2 = 1; lVar2 - (ulong)(uint)nt != 1; lVar2 = lVar2 + 1) {
      pu1_dst[lVar2 + -1] =
           (UWORD8)((int)((uint)pu1_ref[(int)(~uVar4 + nt * 2)] * iVar7 + nt +
                          (uint)pu1_ref[lVar2 + nt * 2] * (iVar6 - uVar4) +
                          (uint)pu1_ref[(long)nt * 3 + 1] * (int)lVar2 +
                         (uint)pu1_ref[iVar6] * (int)uVar5) >> (bVar3 & 0x1f));
      iVar7 = iVar7 + -1;
    }
    pu1_dst = pu1_dst + dst_strd;
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_planar(UWORD8 *pu1_ref,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_dst,
                                  WORD32 dst_strd,
                                  WORD32 nt,
                                  WORD32 mode)
{


    WORD32 row, col;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    UNUSED(src_strd);
    UNUSED(mode);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;
    /* Planar filtering */
    for(row = 0; row < nt; row++)
    {
        for(col = 0; col < nt; col++)
        {
            pu1_dst[row * dst_strd + col] = ((nt - 1 - col)
                            * pu1_ref[two_nt - 1 - row]
                            + (col + 1) * pu1_ref[three_nt + 1]
                            + (nt - 1 - row) * pu1_ref[two_nt + 1 + col]
                            + (row + 1) * pu1_ref[nt - 1] + nt) >> (log2nt + 1);
        }
    }
}